

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EAMAdapter.cpp
# Opt level: O0

vector<double,_std::allocator<double>_> * __thiscall OpenMD::EAMAdapter::getFn(EAMAdapter *this)

{
  ZhouParameters *in_RDI;
  ZhouParameters zhouParam;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff08;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff10;
  EAMAdapter *in_stack_ffffffffffffff88;
  
  getZhouParam(in_stack_ffffffffffffff88);
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  ZhouParameters::~ZhouParameters(in_RDI);
  return (vector<double,_std::allocator<double>_> *)in_RDI;
}

Assistant:

std::vector<RealType> EAMAdapter::getFn() {
    ZhouParameters zhouParam = getZhouParam();
    return zhouParam.Fn;
  }